

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

Var Js::JavascriptOperators::PatchGetMethodFromObject
              (Var instance,RecyclableObject *propertyObject,PropertyId propertyId,
              PropertyValueInfo *info,ScriptContext *scriptContext,bool isRootLd)

{
  code *pcVar1;
  PropertyId propertyId_00;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  PropertyRecord *pPVar5;
  FunctionBody *pFVar6;
  undefined7 in_register_00000089;
  JavascriptFunction *local_50;
  JavascriptFunction *caller;
  RecyclableObject *local_40;
  Var value;
  
  caller._4_4_ = propertyId;
  BVar3 = IsPropertyObject(propertyObject);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    value = scriptContext;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x211c,"(IsPropertyObject(propertyObject))",
                                "IsPropertyObject(propertyObject)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    scriptContext = (ScriptContext *)value;
  }
  local_40 = (RecyclableObject *)0x0;
  value = (Var)CONCAT44(value._4_4_,(int)CONCAT71(in_register_00000089,isRootLd));
  if (isRootLd) {
    propertyObject = (RecyclableObject *)VarTo<Js::RootObjectBase>(instance);
    instance = propertyObject;
  }
  propertyId_00 = caller._4_4_;
  BVar3 = GetPropertyReference_Internal
                    (instance,propertyObject,isRootLd,caller._4_4_,&local_40,scriptContext,info);
  if ((BVar3 == 0) &&
     (bVar2 = ThreadContext::RecordImplicitException(scriptContext->threadContext), bVar2)) {
    pPVar5 = ScriptContext::GetPropertyName(scriptContext,propertyId_00);
    pPVar5 = pPVar5 + 1;
    local_40 = (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
               super_JavascriptLibraryBase).undefinedValue.ptr;
    local_50 = (JavascriptFunction *)0x0;
    BVar3 = JavascriptStackWalker::GetCaller(&local_50,scriptContext);
    if ((BVar3 != 0) &&
       ((pFVar6 = JavascriptFunction::GetFunctionBody(local_50), pFVar6 != (FunctionBody *)0x0 &&
        ((((pFVar6->super_ParseableFunctionInfo).super_FunctionProxy.m_utf8SourceInfo.ptr)->
          field_0xa8 & 8) != 0)))) {
      pPVar5 = (PropertyRecord *)0x0;
    }
    if ((char)value != '\0') {
      JavascriptError::ThrowReferenceError(scriptContext,-0x7ff5ec6f,(PCWSTR)pPVar5);
    }
    local_40 = ThrowErrorObject::CreateThrowTypeErrorObject
                         (scriptContext,-0x7ff5fe4a,(PCWSTR)pPVar5);
  }
  return local_40;
}

Assistant:

Var JavascriptOperators::PatchGetMethodFromObject(Var instance, RecyclableObject* propertyObject, PropertyId propertyId, PropertyValueInfo * info, ScriptContext* scriptContext, bool isRootLd)
    {
        Assert(IsPropertyObject(propertyObject));

        Var value = nullptr;
        BOOL foundValue = FALSE;

        if (isRootLd)
        {
            RootObjectBase* rootObject = VarTo<RootObjectBase>(instance);
            foundValue = JavascriptOperators::GetRootPropertyReference(rootObject, propertyId, &value, scriptContext, info);
        }
        else
        {
            foundValue = JavascriptOperators::GetPropertyReference(instance, propertyObject, propertyId, &value, scriptContext, info);
        }

        if (!foundValue)
        {
            // Don't error if we disabled implicit calls
            if (scriptContext->GetThreadContext()->RecordImplicitException())
            {
                const char16* propertyName = scriptContext->GetPropertyName(propertyId)->GetBuffer();

                value = scriptContext->GetLibrary()->GetUndefined();
                JavascriptFunction * caller = NULL;
                if (JavascriptStackWalker::GetCaller(&caller, scriptContext))
                {
                    FunctionBody * callerBody = caller->GetFunctionBody();
                    if (callerBody && callerBody->GetUtf8SourceInfo()->GetIsXDomain())
                    {
                        propertyName = NULL;
                    }
                }

                // Prior to version 12 we had mistakenly immediately thrown an error for property reference method calls
                // (i.e. <expr>.foo() form) when the target object is the global object.  The spec says that a GetValue
                // on a reference should throw if the reference is unresolved, of which a property reference can never be,
                // however it can be unresolved in the case of an identifier expression, e.g. foo() with no qualification.
                // Such a case would come down to the global object if foo was undefined, hence the check for root object,
                // except that it should have been a check for isRootLd to be correct.
                //
                //   // (at global scope)
                //   foo(x());
                //
                // should throw an error before evaluating x() if foo is not defined, but
                //
                //   // (at global scope)
                //   this.foo(x());
                //
                // should evaluate x() before throwing an error if foo is not a property on the global object.
                // Maintain old behavior prior to version 12.
                bool isPropertyReference = !isRootLd;
                if (!isPropertyReference)
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UndefVariable, propertyName);
                }
                else
                {
                    // ES5 11.2.3 #2: We evaluate the call target but don't throw yet if target member is missing. We need to evaluate argList
                    // first (#3). Postpone throwing error to invoke time.
                    value = ThrowErrorObject::CreateThrowTypeErrorObject(scriptContext, VBSERR_OLENoPropOrMethod, propertyName);
                }
            }
        }
        return value;
    }